

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathutil.c
# Opt level: O2

int is_prime(uint64_t n)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  size_t i;
  long lVar9;
  uint64_t r;
  ulong uVar10;
  
  if (n == 1 || (n & 1) == 0) {
    uVar4 = (uint)(n == 2);
  }
  else {
    uVar1 = n - 1;
    uVar8 = 0;
    uVar6 = 2;
    do {
      uVar5 = uVar6;
      uVar8 = uVar8 + 1;
      uVar6 = uVar5 * 2;
    } while ((uVar5 * 2 - 1 & uVar1) == 0);
    for (lVar9 = 0; (lVar9 != 7 && ((ulong)(&DAT_00102010)[lVar9] < n)); lVar9 = lVar9 + 1) {
      uVar6 = expmod((&DAT_00102010)[lVar9],uVar1 / uVar5,n);
      if (uVar6 != uVar1 && uVar6 != 1) {
        lVar7 = 0;
        for (uVar10 = 1; uVar10 < uVar8; uVar10 = uVar10 + 1) {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar6;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar6;
          uVar6 = __umodti3(SUB168(auVar2 * auVar3,0),SUB168(auVar2 * auVar3,8),n,0);
          lVar7 = lVar7 + (ulong)(uVar1 != uVar6);
        }
        if (lVar7 + 1U == uVar8) {
          return 0;
        }
      }
    }
    uVar4 = 1;
  }
  return uVar4;
}

Assistant:

int is_prime(uint64_t n) {
    if(n % 2 == 0 || n == 1)
        return n == 2 ? 1 : 0;

    // perform (deterministic) Miller-Rabin primality test

    uint64_t s = 1;
    uint64_t t = 2;
    while((n-1) % (t<<1) == 0) {
        s++;
        t <<= 1;
    }
    uint64_t d = (n-1) / t;

    // these bases should be sufficient to test all n < 2^64
    uint64_t bases[] = {2, 325, 9375, 28178, 450775, 9780504, 1795265022};

    for(size_t i = 0; i < 7; i++) {
        uint64_t a = bases[i];
        if(a >= n)
            break;

        uint64_t tmp = expmod(a, d, n);
        if(tmp != 1 && tmp != n-1) {
            size_t cnt = 0;
            for(uint64_t r = 1; r < s; r++) {
                tmp = mulmod(tmp, tmp, n);
                if(tmp != n-1)
                    cnt++;
            }
            if(cnt == s-1)
                return 0;
        }

    }

    return 1;
}